

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

Result __thiscall
presolve::HPresolve::initialRowAndColPresolve(HPresolve *this,HighsPostsolveStack *postsolve_stack)

{
  Result RVar1;
  reference pvVar2;
  reference pvVar3;
  long *in_RDI;
  Result __result_1;
  HighsInt col;
  Result __result;
  HighsInt row;
  HighsPostsolveStack *in_stack_00000050;
  HPresolve *in_stack_00000058;
  double in_stack_00000060;
  HighsInt in_stack_0000006c;
  HPresolve *in_stack_00000070;
  HighsInt in_stack_000000fc;
  HighsPostsolveStack *in_stack_00000100;
  HPresolve *in_stack_00000108;
  HighsInt in_stack_0000087c;
  HighsPostsolveStack *in_stack_00000880;
  HPresolve *in_stack_00000888;
  int local_24;
  int local_1c;
  
  for (local_1c = 0; local_1c != *(int *)(*in_RDI + 4); local_1c = local_1c + 1) {
    pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0xb9),
                        (long)local_1c);
    if (*pvVar2 == '\0') {
      RVar1 = rowPresolve(in_stack_00000888,in_stack_00000880,in_stack_0000087c);
      if (RVar1 != kOk) {
        return RVar1;
      }
      pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x95),
                          (long)local_1c);
      *pvVar2 = '\0';
    }
  }
  local_24 = 0;
  do {
    if (local_24 == *(int *)*in_RDI) {
      RVar1 = checkLimits(in_stack_00000058,in_stack_00000050);
      return RVar1;
    }
    pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0xbc),
                        (long)local_24);
    if (*pvVar2 == '\0') {
      pvVar3 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                         ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)(*in_RDI + 0x178),
                          (long)local_24);
      if (*pvVar3 != kContinuous) {
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x20),(long)local_24);
        changeColLower(in_stack_00000070,in_stack_0000006c,in_stack_00000060);
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x38),(long)local_24);
        changeColUpper(in_stack_00000070,in_stack_0000006c,in_stack_00000060);
      }
      RVar1 = colPresolve(in_stack_00000108,in_stack_00000100,in_stack_000000fc);
      if (RVar1 != kOk) {
        return RVar1;
      }
      pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x9b),
                          (long)local_24);
      *pvVar2 = '\0';
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

HPresolve::Result HPresolve::initialRowAndColPresolve(
    HighsPostsolveStack& postsolve_stack) {
  // do a full scan over the rows as the singleton arrays and the changed row
  // arrays are not initialized, also unset changedRowFlag so that the row will
  // be added to the changed row vector when it is changed after it was
  // processed
  for (HighsInt row = 0; row != model->num_row_; ++row) {
    if (rowDeleted[row]) continue;
    HPRESOLVE_CHECKED_CALL(rowPresolve(postsolve_stack, row));
    changedRowFlag[row] = false;
  }

  // same for the columns
  for (HighsInt col = 0; col != model->num_col_; ++col) {
    if (colDeleted[col]) continue;
    if (model->integrality_[col] != HighsVarType::kContinuous) {
      // round and update bounds
      changeColLower(col, model->col_lower_[col]);
      changeColUpper(col, model->col_upper_[col]);
    }
    HPRESOLVE_CHECKED_CALL(colPresolve(postsolve_stack, col));
    changedColFlag[col] = false;
  }

  return checkLimits(postsolve_stack);
}